

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

uint64_t skiwi::skiwi_run_raw(string *scheme_expression)

{
  runtime_error *this;
  uint64_t uVar1;
  string *scheme_expression_local;
  
  if (((anonymous_namespace)::cd[0] & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Skiwi is not initialized");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = anon_unknown_1::compile_and_run
                    (scheme_expression,(environment_map *)((anonymous_namespace)::cd + 0x220),
                     (repl_data *)((anonymous_namespace)::cd + 0x188));
  return uVar1;
}

Assistant:

uint64_t skiwi_run_raw(const std::string& scheme_expression)
  {
  if (!cd.initialized)
    throw std::runtime_error("Skiwi is not initialized");
  return compile_and_run(scheme_expression, cd.env, cd.rd);
  }